

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_GlobalScanMin_Test::TestBody(MxxReduce_GlobalScanMin_Test *this)

{
  size_t i;
  size_type sVar1;
  char *pcVar2;
  long lVar3;
  size_type __n;
  bool bVar4;
  AssertHelper local_b8;
  AssertHelper local_b0;
  AssertionResult gtest_ar_1;
  vector<int,_std::allocator<int>_> result;
  vector<int,_std::allocator<int>_> local;
  vector<int,_std::allocator<int>_> local_cpy;
  comm c;
  
  mxx::comm::comm(&c);
  __n = (size_type)c.m_size;
  std::vector<int,_std::allocator<int>_>::vector(&local,__n,(allocator_type *)&local_cpy);
  for (sVar1 = 0; __n != sVar1; sVar1 = sVar1 + 1) {
    local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [sVar1] = c.m_rank * c.m_size + (int)sVar1 + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_cpy,&local);
  mxx::
  global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,mxx::min<int>>
            (local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,
             local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish,&c);
  lVar3 = 0;
  sVar1 = __n;
  while (bVar4 = sVar1 != 0, sVar1 = sVar1 - 1, bVar4) {
    gtest_ar_1.success_ = true;
    gtest_ar_1._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&result,"1","local_cpy[i]",(int *)&gtest_ar_1,
               (int *)((long)local_cpy.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar3));
    if ((char)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == '\0') {
      testing::Message::Message((Message *)&gtest_ar_1);
      if (result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish == (pointer)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x122,pcVar2);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&gtest_ar_1);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
      goto LAB_0011fdb4;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    lVar3 = lVar3 + 4;
  }
  mxx::global_scan<int,mxx::min<int>>(&result,(mxx *)&local,&c);
  local_b8.data_ =
       (AssertHelperData *)
       ((long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start >> 2);
  local_b0.data_ =
       (AssertHelperData *)
       ((long)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        CONCAT71(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start._1_7_,
                 (char)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_1,"local.size()","result.size()",(unsigned_long *)&local_b8,
             (unsigned_long *)&local_b0);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0x126,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b8);
LAB_0011fda5:
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_1.message_);
    lVar3 = 0;
    while (bVar4 = __n != 0, __n = __n - 1, bVar4) {
      local_b8.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar_1,"1","result[i]",(int *)&local_b8,
                 (int *)(CONCAT71(result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._1_7_,
                                  (char)result.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start) + lVar3));
      if (gtest_ar_1.success_ == false) {
        testing::Message::Message((Message *)&local_b8);
        if (gtest_ar_1.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_b0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x129,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_b0);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_b8);
        goto LAB_0011fda5;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_1.message_);
      lVar3 = lVar3 + 4;
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&result.super__Vector_base<int,_std::allocator<int>_>);
LAB_0011fdb4:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_cpy.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local.super__Vector_base<int,_std::allocator<int>_>);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, GlobalScanMin) {
    mxx::comm c;
    // test scan with min and an array of positive
    // elements sorted in ascending order
    size_t n = c.size();
    std::vector<int> local(n);
    for (size_t i = 0; i < n; ++i) {
        local[i] = (c.rank()*n)+i+1;
    }
    // test inplace scan
    std::vector<int> local_cpy(local);
    mxx::global_scan_inplace(local_cpy.begin(), local_cpy.end(), mxx::min<int>(), c);
    for (size_t i = 0; i < n; ++i) {
        // 1 is both the first as well as the minimum element
        ASSERT_EQ(1, local_cpy[i]);
    }
    // test scan
    std::vector<int> result = mxx::global_scan(local, mxx::min<int>(), c);
    ASSERT_EQ(local.size(), result.size());
    for (size_t i = 0; i < n; ++i) {
        // 1 is both the first as well as the minimum element
        ASSERT_EQ(1, result[i]);
    }
}